

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O2

void __thiscall
gl3cts::TransformFeedback::QueryVertexInterleaved::QueryVertexInterleaved
          (QueryVertexInterleaved *this,Context *context,char *test_name,char *test_description)

{
  CaptureVertexInterleaved::CaptureVertexInterleaved
            (&this->super_CaptureVertexInterleaved,context,test_name,test_description);
  (this->super_CaptureVertexInterleaved).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
       = (_func_int **)&PTR__CaptureVertexInterleaved_01db2918;
  this->m_query_object = 0;
  (this->super_CaptureVertexInterleaved).m_max_vertices_drawn = 3;
  return;
}

Assistant:

gl3cts::TransformFeedback::QueryVertexInterleaved::QueryVertexInterleaved(deqp::Context& context, const char* test_name,
																		  const char* test_description)
	: CaptureVertexInterleaved(context, test_name, test_description), m_query_object(0)
{
	m_max_vertices_drawn = 3; /* Make buffer smaller up to 3 vertices. */
}